

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

void Option::prepareProject(QString *pfile)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QString srcpath;
  QString *in_stack_ffffffffffffffb0;
  QMakeGlobals *in_stack_ffffffffffffffb8;
  QFileInfo local_30 [8];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  uStack_20 = 0xaaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&stack0xffffffffffffffb0,(QString *)in_RDI);
  QFileInfo::absolutePath();
  QFileInfo::QFileInfo(local_30,(QString *)&stack0xffffffffffffffb8);
  QFileInfo::canonicalFilePath();
  QFileInfo::~QFileInfo(local_30);
  QString::~QString((QString *)0x326987);
  QFileInfo::~QFileInfo((QFileInfo *)&stack0xffffffffffffffb0);
  QMakeGlobals::setDirectories(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_RDI);
  QString::~QString((QString *)0x3269b3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Option::prepareProject(const QString &pfile)
{
    // Canonicalize only the directory, otherwise things will go haywire
    // if the file itself is a symbolic link.
    const QString srcpath = QFileInfo(QFileInfo(pfile).absolutePath()).canonicalFilePath();
    globals->setDirectories(srcpath, output_dir);
}